

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

bool __thiscall
wabt::WastParser::ParseTextListOpt
          (WastParser *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  char c;
  bool bVar1;
  Result RVar2;
  char *pcVar3;
  uint32_t *__args;
  char *pcVar4;
  pointer psVar6;
  byte local_a9;
  uint32_t hi;
  uint32_t lo;
  string_view *local_90;
  TextVector texts;
  Token local_70;
  char *pcVar5;
  
  texts.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texts.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texts.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    bVar1 = PeekMatch(this,Text);
    if (!bVar1) break;
    Consume(&local_70,this);
    _hi = Token::text(&local_70);
    std::vector<wabt::string_view,_std::allocator<wabt::string_view>_>::
    emplace_back<wabt::string_view>(&texts,(string_view *)&hi);
  }
  local_90 = texts.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>._M_impl
             .super__Vector_impl_data._M_finish;
  psVar6 = texts.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (psVar6 == local_90) {
      bVar1 = texts.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              texts.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>.
              _M_impl.super__Vector_impl_data._M_finish;
      std::_Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>::~_Vector_base
                (&texts.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>);
      return bVar1;
    }
    local_70.loc.filename = *psVar6;
    if (2 < psVar6->size_) {
      local_70.loc.filename = string_view::substr((string_view *)&local_70,1,psVar6->size_ - 2);
      pcVar4 = local_70.loc.filename.data_;
      pcVar3 = pcVar4 + local_70.loc.filename.size_;
      while (pcVar4 < pcVar3) {
        if (*pcVar4 == '\\') {
          pcVar5 = pcVar4 + 1;
          c = pcVar4[1];
          if (c == '\"') {
            hi._0_1_ = 0x22;
          }
          else if (c == '\'') {
            hi._0_1_ = 0x27;
          }
          else if (c == '\\') {
            hi._0_1_ = 0x5c;
          }
          else if (c == 't') {
            hi._0_1_ = 9;
          }
          else if (c == 'r') {
            hi._0_1_ = 0xd;
          }
          else {
            if (c != 'n') {
              RVar2 = ParseHexdigit(c,&hi);
              if (RVar2.enum_ != Ok) {
LAB_00168cfb:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/wast-parser.cc"
                              ,0x58,
                              "void wabt::(anonymous namespace)::RemoveEscapes(string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::vector<unsigned char>>]"
                             );
              }
              RVar2 = ParseHexdigit(pcVar4[2],&lo);
              if (RVar2.enum_ != Ok) goto LAB_00168cfb;
              local_a9 = (byte)(hi << 4) | (byte)lo;
              __args = (uint32_t *)&local_a9;
              pcVar5 = pcVar4 + 2;
              goto LAB_00168c53;
            }
            hi._0_1_ = 10;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (out_data,(uchar *)&hi);
        }
        else {
          hi._0_1_ = *pcVar4;
          __args = &hi;
          pcVar5 = pcVar4;
LAB_00168c53:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (out_data,(uchar *)__args);
        }
        pcVar4 = pcVar5 + 1;
      }
    }
    psVar6 = psVar6 + 1;
  } while( true );
}

Assistant:

bool WastParser::ParseTextListOpt(std::vector<uint8_t>* out_data) {
  WABT_TRACE(ParseTextListOpt);
  TextVector texts;
  while (PeekMatch(TokenType::Text))
    texts.push_back(Consume().text());

  RemoveEscapes(texts, std::back_inserter(*out_data));
  return !texts.empty();
}